

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::UnsafeArenaSetAllocatedMessage
          (GeneratedMessageReflection *this,Message *message,Message *sub_message,
          FieldDescriptor *field)

{
  int number;
  long *plVar1;
  Type TVar2;
  uint32 uVar3;
  ulong uVar4;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  TVar2 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar2 = FieldDescriptor::type(field);
    ExtensionSet::UnsafeArenaSetAllocatedMessage
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),number,
               (FieldType)TVar2,field,&sub_message->super_MessageLite);
    return;
  }
  if (*(OneofDescriptor **)(field + 0x60) == (OneofDescriptor *)0x0) {
    if (sub_message == (Message *)0x0) {
      ClearBit(this,message,field);
    }
    else {
      SetBit(this,message,field);
    }
    uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar4 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar4 & 1) != 0) {
      uVar4 = *(ulong *)((uVar4 & 0xfffffffffffffffe) + 8);
    }
    if ((uVar4 == 0) &&
       (plVar1 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
       plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3) =
         sub_message;
  }
  else {
    ClearOneof(this,message,*(OneofDescriptor **)(field + 0x60));
    if (sub_message != (Message *)0x0) {
      uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
      *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3) =
           sub_message;
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(*(long *)(field + 0x60) -
                                  *(long *)(*(long *)(*(long *)(field + 0x60) + 0x10) + 0x40)) >> 4)
                     * -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x38);
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::UnsafeArenaSetAllocatedMessage(
    Message* message,
    Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (field->containing_oneof()) {
      if (sub_message == NULL) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == NULL) {
      ClearBit(message, field);
    } else {
      SetBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (GetArena(message) == NULL) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}